

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsgf.c
# Opt level: O1

jsgf_rule_t * jsgf_get_public_rule(jsgf_t *grammar)

{
  char *__s;
  jsgf_rule_t *pjVar1;
  char *pcVar2;
  bool bVar3;
  int iVar4;
  hash_iter_t *itor;
  char *pcVar5;
  jsgf_rule_t *pjVar6;
  
  itor = hash_table_iter(grammar->rules);
  if (itor == (hash_iter_t *)0x0) {
    pjVar6 = (jsgf_rule_t *)0x0;
  }
  else {
    pjVar6 = (jsgf_rule_t *)0x0;
    do {
      pjVar1 = (jsgf_rule_t *)itor->ent->val;
      bVar3 = true;
      if (pjVar1->is_public != 0) {
        pcVar2 = pjVar1->name;
        __s = pcVar2 + 1;
        pcVar5 = strrchr(__s,0x2e);
        if ((pcVar5 == (char *)0x0) ||
           (iVar4 = strncmp(__s,grammar->name,(size_t)(pcVar5 + ~(ulong)pcVar2)), iVar4 == 0)) {
          hash_table_iter_free(itor);
          bVar3 = false;
          pjVar6 = pjVar1;
        }
      }
    } while ((bVar3) && (itor = hash_table_iter_next(itor), itor != (hash_iter_t *)0x0));
  }
  return pjVar6;
}

Assistant:

jsgf_rule_t *
jsgf_get_public_rule(jsgf_t * grammar)
{
    jsgf_rule_iter_t *itor;
    jsgf_rule_t *public_rule = NULL;

    for (itor = jsgf_rule_iter(grammar); itor;
         itor = jsgf_rule_iter_next(itor)) {
        jsgf_rule_t *rule = jsgf_rule_iter_rule(itor);
        if (jsgf_rule_public(rule)) {
            const char *rule_name = jsgf_rule_name(rule);
            char *dot_pos;
            if ((dot_pos = strrchr(rule_name + 1, '.')) == NULL) {
                public_rule = rule;
                jsgf_rule_iter_free(itor);
                break;
            }
            if (0 ==
                strncmp(rule_name + 1, jsgf_grammar_name(grammar),
                        dot_pos - rule_name - 1)) {
                public_rule = rule;
                jsgf_rule_iter_free(itor);
                break;
            }
        }
    }
    return public_rule;
}